

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDarFrames(Abc_Ntk_t *pNtk,int nPrefix,int nFrames,int fInit,int fVerbose)

{
  Aig_Man_t *pAig;
  Aig_Man_t *pMan_00;
  char *pcVar1;
  Aig_Man_t *pTemp;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtkAig;
  int fVerbose_local;
  int fInit_local;
  int nFrames_local;
  int nPrefix_local;
  Abc_Ntk_t *pNtk_local;
  
  pAig = Abc_NtkToDar(pNtk,0,1);
  if (pAig == (Aig_Man_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    pMan_00 = Saig_ManTimeframeSimplify(pAig,nPrefix,nFrames,fInit,fVerbose);
    Aig_ManStop(pAig);
    if (pMan_00 == (Aig_Man_t *)0x0) {
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    else {
      pNtk_local = Abc_NtkFromAigPhase(pMan_00);
      pcVar1 = Extra_UtilStrsav(pNtk->pName);
      pNtk_local->pName = pcVar1;
      pcVar1 = Extra_UtilStrsav(pNtk->pSpec);
      pNtk_local->pSpec = pcVar1;
      Aig_ManStop(pMan_00);
    }
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarFrames( Abc_Ntk_t * pNtk, int nPrefix, int nFrames, int fInit, int fVerbose )
{
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan, * pTemp;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return NULL;
    pMan = Saig_ManTimeframeSimplify( pTemp = pMan, nPrefix, nFrames, fInit, fVerbose );
    Aig_ManStop( pTemp );
    if ( pMan == NULL )
        return NULL;
    pNtkAig = Abc_NtkFromAigPhase( pMan );
    pNtkAig->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkAig->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    Aig_ManStop( pMan );
    return pNtkAig;
}